

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

void __thiscall CMU462::OSDText::draw_line(OSDText *this,OSDLine *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FT_Vector FVar5;
  FT_GlyphSlot_conflict pFVar6;
  int iVar7;
  char *pcVar8;
  GLuint tex;
  float local_78;
  float local_74;
  undefined8 local_70;
  float local_68;
  float local_64;
  undefined8 local_60;
  float local_58;
  float local_54;
  undefined8 local_50;
  float local_48;
  float local_44;
  undefined8 local_40;
  
  FT_Set_Pixel_Sizes(*this->face,0,(int)line->size);
  (*__glewUniform4fv)(this->uniform_color,1,&(line->color).r);
  pFVar6 = (*this->face)->glyph;
  (*__glewActiveTexture)(0x84c0);
  glGenTextures(1,&tex);
  glBindTexture(0xde1,tex);
  (*__glewUniform1i)(this->uniform_tex,0);
  glPixelStorei(0xcf5,1);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  (*__glewEnableVertexAttribArray)(this->attribute_coord);
  (*__glewBindBuffer)(0x8892,this->vbo);
  (*__glewVertexAttribPointer)(this->attribute_coord,4,0x1406,'\0',0,(void *)0x0);
  for (pcVar8 = (line->text)._M_dataplus._M_p; (long)*pcVar8 != 0; pcVar8 = pcVar8 + 1) {
    iVar7 = FT_Load_Char(*this->face,(long)*pcVar8,4);
    if (iVar7 == 0) {
      glTexImage2D(0xde1,0,0x1906,(pFVar6->bitmap).width,(pFVar6->bitmap).rows,0,0x1906,0x1401,
                   (pFVar6->bitmap).buffer);
      local_78 = (float)pFVar6->bitmap_left * this->sx + line->x;
      local_74 = -(-(float)pFVar6->bitmap_top * this->sy - line->y);
      local_70 = 0;
      local_68 = (float)(pFVar6->bitmap).width * this->sx + local_78;
      local_60 = 0x3f800000;
      local_54 = local_74 - (float)(pFVar6->bitmap).rows * this->sy;
      local_50 = 0x3f80000000000000;
      local_40 = 0x3f8000003f800000;
      local_64 = local_74;
      local_58 = local_78;
      local_48 = local_68;
      local_44 = local_54;
      (*__glewBufferData)(0x8892,0x40,&local_78,0x88e8);
      glDrawArrays(5,0,4);
      FVar5 = pFVar6->advance;
      uVar1 = this->sx;
      uVar3 = this->sy;
      uVar2 = line->x;
      uVar4 = line->y;
      line->x = (float)uVar2 +
                (float)uVar1 * (float)CONCAT44(FVar5.x._4_4_ >> 6,(int)((ulong)FVar5.x >> 6));
      line->y = (float)uVar4 +
                (float)uVar3 * (float)CONCAT44(FVar5.y._4_4_ >> 6,(int)((ulong)FVar5.y >> 6));
    }
  }
  (*__glewDisableVertexAttribArray)(this->attribute_coord);
  glDeleteTextures(1,&tex);
  return;
}

Assistant:

void OSDText::draw_line(OSDLine line) {

  // set font size
  FT_Set_Pixel_Sizes(*face, 0, line.size);

  // set font color
  glUniform4fv(uniform_color, 1, (GLfloat*) &line.color);

  // get glyph
  const char *p;
  FT_GlyphSlot g = (*face)->glyph;

  // gen texture
  GLuint tex;
  glActiveTexture(GL_TEXTURE0);
  glGenTextures(1, &tex);
  glBindTexture(GL_TEXTURE_2D, tex);
  glUniform1i(uniform_tex, 0);

  // require 1 byte alignment when uploading texture data
  glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

  // clamping to edges is important to prevent artifacts when scaling
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

  // linear filtering usually looks best for text
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

  // set up the VBO for our vertex data
  glEnableVertexAttribArray(attribute_coord);
  glBindBuffer(GL_ARRAY_BUFFER, vbo);
  glVertexAttribPointer(attribute_coord, 4, GL_FLOAT, GL_FALSE, 0, 0);

  // loop through all characters
  const char* text = line.text.c_str();
  for (p = text; *p; p++) {

    // Try to load and render the character
    if (FT_Load_Char(*face, *p, FT_LOAD_RENDER)) continue;

    // Upload the glyph bitmap as an alpha texture
    glTexImage2D(GL_TEXTURE_2D,
                 0, GL_ALPHA, g->bitmap.width, g->bitmap.rows,
                 0, GL_ALPHA, GL_UNSIGNED_BYTE, g->bitmap.buffer);

    // calculate the vertex and texture coordinates
    float x2 =  line.x + g->bitmap_left * sx;
    float y2 = -line.y - g->bitmap_top  * sy;
    float w = g->bitmap.width * sx;
    float h = g->bitmap.rows  * sy;

    point box[4] = {
      {x2, -y2, 0, 0},
      {x2 + w, -y2, 1, 0},
      {x2, -y2 - h, 0, 1},
      {x2 + w, -y2 - h, 1, 1},
    };

    // draw the character to screen
    glBufferData(GL_ARRAY_BUFFER, sizeof box, box, GL_DYNAMIC_DRAW);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // Advance the cursor to the start of the next character
    line.x += (g->advance.x >> 6) * sx;
    line.y += (g->advance.y >> 6) * sy;
  }

  glDisableVertexAttribArray(attribute_coord);
  glDeleteTextures(1, &tex);

}